

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_compress_insertDictionary
                 (ZSTD_compressedBlockState_t *bs,ZSTD_matchState_t *ms,ldmState_t *ls,
                 ZSTD_cwksp *ws,ZSTD_CCtx_params *params,void *dict,size_t dictSize,
                 ZSTD_dictContentType_e dictContentType,ZSTD_dictTableLoadMethod_e dtlm,
                 void *workspace)

{
  U32 *pUVar1;
  U32 maxSymbolValue;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  long lVar5;
  size_t err_code;
  ulong srcSize;
  uint local_94;
  ZSTD_matchState_t *local_90;
  ZSTD_cwksp *local_88;
  ZSTD_CCtx_params *local_80;
  short offcodeNCount [32];
  
  if (dict == (void *)0x0 || dictSize < 8) {
    return (ulong)(dictContentType != ZSTD_dct_fullDict) * 0x20 - 0x20;
  }
  local_90 = ms;
  local_88 = ws;
  local_80 = params;
  ZSTD_reset_compressedBlockState(bs);
  if (dictContentType != ZSTD_dct_rawContent) {
    if (*dict == -0x13cf5bc9) {
      local_94 = 0x1f;
      if ((local_80->fParams).noDictIDFlag == 0) {
        sVar4 = (size_t)*(uint *)((long)dict + 4);
      }
      else {
        sVar4 = 0;
      }
      sVar2 = ZSTD_loadCEntropy(bs,workspace,offcodeNCount,&local_94,dict,dictSize);
      if (0xffffffffffffff88 < sVar2) {
        return sVar2;
      }
      srcSize = dictSize - sVar2;
      if (srcSize >> 0x11 < 0x7fff) {
        maxSymbolValue = ZSTD_highbit32((int)srcSize + 0x20000);
      }
      else {
        maxSymbolValue = 0x1f;
      }
      sVar3 = ZSTD_checkDictNCount(offcodeNCount,local_94,maxSymbolValue);
      if (0xffffffffffffff88 < sVar3) {
        return sVar3;
      }
      lVar5 = 0;
      while( true ) {
        if (lVar5 == 3) {
          (bs->entropy).fse.offcode_repeatMode = FSE_repeat_valid;
          (bs->entropy).fse.matchlength_repeatMode = FSE_repeat_valid;
          (bs->entropy).fse.litlength_repeatMode = FSE_repeat_valid;
          ZSTD_loadDictionaryContent
                    (local_90,(ldmState_t *)0x0,local_88,local_80,(void *)((long)dict + sVar2),
                     srcSize,dtlm);
          return sVar4;
        }
        pUVar1 = bs->rep + lVar5;
        if ((ulong)*pUVar1 == 0) break;
        lVar5 = lVar5 + 1;
        if (srcSize < *pUVar1) {
          return 0xffffffffffffffe2;
        }
      }
      return 0xffffffffffffffe2;
    }
    if (dictContentType == ZSTD_dct_fullDict) {
      return 0xffffffffffffffe0;
    }
    if (dictContentType != ZSTD_dct_auto) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x3620,
                    "size_t ZSTD_compress_insertDictionary(ZSTD_compressedBlockState_t *, ZSTD_matchState_t *, ldmState_t *, ZSTD_cwksp *, const ZSTD_CCtx_params *, const void *, size_t, ZSTD_dictContentType_e, ZSTD_dictTableLoadMethod_e, void *)"
                   );
    }
  }
  ZSTD_loadDictionaryContent(local_90,ls,local_88,local_80,dict,dictSize,dtlm);
  return 0;
}

Assistant:

static size_t
ZSTD_compress_insertDictionary(ZSTD_compressedBlockState_t* bs,
                               ZSTD_matchState_t* ms,
                               ldmState_t* ls,
                               ZSTD_cwksp* ws,
                         const ZSTD_CCtx_params* params,
                         const void* dict, size_t dictSize,
                               ZSTD_dictContentType_e dictContentType,
                               ZSTD_dictTableLoadMethod_e dtlm,
                               void* workspace)
{
    DEBUGLOG(4, "ZSTD_compress_insertDictionary (dictSize=%u)", (U32)dictSize);
    if ((dict==NULL) || (dictSize<8)) {
        RETURN_ERROR_IF(dictContentType == ZSTD_dct_fullDict, dictionary_wrong);
        return 0;
    }

    ZSTD_reset_compressedBlockState(bs);

    /* dict restricted modes */
    if (dictContentType == ZSTD_dct_rawContent)
        return ZSTD_loadDictionaryContent(ms, ls, ws, params, dict, dictSize, dtlm);

    if (MEM_readLE32(dict) != ZSTD_MAGIC_DICTIONARY) {
        if (dictContentType == ZSTD_dct_auto) {
            DEBUGLOG(4, "raw content dictionary detected");
            return ZSTD_loadDictionaryContent(
                ms, ls, ws, params, dict, dictSize, dtlm);
        }
        RETURN_ERROR_IF(dictContentType == ZSTD_dct_fullDict, dictionary_wrong);
        assert(0);   /* impossible */
    }

    /* dict as full zstd dictionary */
    return ZSTD_loadZstdDictionary(
        bs, ms, ws, params, dict, dictSize, dtlm, workspace);
}